

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerMSL::ensure_correct_input_type
          (CompilerMSL *this,uint32_t type_id,uint32_t location,uint32_t num_components)

{
  int iVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  iterator iVar4;
  CompilerError *pCVar5;
  BaseType basetype;
  uint components;
  allocator local_4d;
  uint32_t location_local;
  string local_48;
  
  location_local = location;
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,type_id);
  iVar4 = ::std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::_Select1st<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
          ::find(&(this->inputs_by_location)._M_t,&location_local);
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(this->inputs_by_location)._M_t._M_impl.super__Rb_tree_header) {
    if (num_components <= pSVar3->vecsize) {
      return type_id;
    }
  }
  else {
    if (num_components == 0) {
      num_components = *(uint32_t *)&iVar4._M_node[1]._M_left;
    }
    if (*(int *)&iVar4._M_node[1]._M_parent == 2) {
      iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
      if (iVar1 != 8) {
        if (iVar1 == 7) goto switchD_002926cd_caseD_7;
        if (iVar1 != 6) {
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_48,"Vertex attribute type mismatch between host and shader",
                     &local_4d);
          CompilerError::CompilerError(pCVar5,&local_48);
          __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    else if (*(int *)&iVar4._M_node[1]._M_parent == 1) {
      switch(*(undefined4 *)&(pSVar3->super_IVariant).field_0xc) {
      case 4:
      case 6:
      case 8:
        break;
      case 5:
        components = pSVar3->vecsize;
        if (pSVar3->vecsize < num_components) {
          components = num_components;
        }
        basetype = UShort;
        goto LAB_00292719;
      case 7:
switchD_002926cd_caseD_7:
        components = pSVar3->vecsize;
        if (pSVar3->vecsize < num_components) {
          components = num_components;
        }
        basetype = UInt;
        goto LAB_00292719;
      default:
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_48,"Vertex attribute type mismatch between host and shader",
                   &local_4d);
        CompilerError::CompilerError(pCVar5,&local_48);
        __cxa_throw(pCVar5,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    if (num_components <= pSVar3->vecsize) {
      return type_id;
    }
  }
  basetype = Unknown;
  components = num_components;
LAB_00292719:
  uVar2 = build_extended_vector_type(this,type_id,components,basetype);
  return uVar2;
}

Assistant:

uint32_t CompilerMSL::ensure_correct_input_type(uint32_t type_id, uint32_t location, uint32_t num_components)
{
	auto &type = get<SPIRType>(type_id);

	auto p_va = inputs_by_location.find(location);
	if (p_va == end(inputs_by_location))
	{
		if (num_components > type.vecsize)
			return build_extended_vector_type(type_id, num_components);
		else
			return type_id;
	}

	if (num_components == 0)
		num_components = p_va->second.vecsize;

	switch (p_va->second.format)
	{
	case MSL_SHADER_INPUT_FORMAT_UINT8:
	{
		switch (type.basetype)
		{
		case SPIRType::UByte:
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Short:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UShort);
		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	case MSL_SHADER_INPUT_FORMAT_UINT16:
	{
		switch (type.basetype)
		{
		case SPIRType::UShort:
		case SPIRType::UInt:
			if (num_components > type.vecsize)
				return build_extended_vector_type(type_id, num_components);
			else
				return type_id;

		case SPIRType::Int:
			return build_extended_vector_type(type_id, num_components > type.vecsize ? num_components : type.vecsize,
			                                  SPIRType::UInt);

		default:
			SPIRV_CROSS_THROW("Vertex attribute type mismatch between host and shader");
		}
	}

	default:
		if (num_components > type.vecsize)
			type_id = build_extended_vector_type(type_id, num_components);
		break;
	}

	return type_id;
}